

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)

{
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  int in_EDI;
  ImGuiTable *table;
  ImGuiContext *g;
  int local_8;
  ImGuiTableColumnFlags local_4;
  
  pIVar1 = GImGui->CurrentTable;
  if (pIVar1 == (ImGuiTable *)0x0) {
    local_4 = 0;
  }
  else {
    local_8 = in_EDI;
    if (in_EDI < 0) {
      local_8 = pIVar1->CurrentColumn;
    }
    if (local_8 == pIVar1->ColumnsCount) {
      local_4 = 0;
      if (pIVar1->HoveredColumnBody == local_8) {
        local_4 = 0x800000;
      }
    }
    else {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,local_8);
      local_4 = pIVar2->Flags;
    }
  }
  return local_4;
}

Assistant:

ImGuiTableColumnFlags ImGui::TableGetColumnFlags(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return ImGuiTableColumnFlags_None;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)
        return (table->HoveredColumnBody == column_n) ? ImGuiTableColumnFlags_IsHovered : ImGuiTableColumnFlags_None;
    return table->Columns[column_n].Flags;
}